

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_it_envelopes(IT_PLAYING *playing)

{
  int iVar1;
  IT_PLAYING_ENVELOPE *in_RDI;
  IT_PLAYING_ENVELOPE *pe;
  IT_ENVELOPE *envelope;
  int flags;
  IT_PLAYING_ENVELOPE *pe_00;
  
  flags = (int)((ulong)(*(long *)&in_RDI[2].value + 0x30) >> 0x20);
  pe_00 = in_RDI;
  iVar1 = update_it_envelope((IT_PLAYING *)envelope,(IT_ENVELOPE *)pe,in_RDI,flags);
  if ((iVar1 != 0) && (pe_00->next_node = pe_00->next_node | 4, in_RDI[10].tick == 0)) {
    pe_00->next_node = pe_00->next_node | 8;
  }
  update_it_envelope((IT_PLAYING *)envelope,(IT_ENVELOPE *)pe,pe_00,flags);
  update_it_envelope((IT_PLAYING *)envelope,(IT_ENVELOPE *)pe,pe_00,flags);
  return;
}

Assistant:

static void update_it_envelopes(IT_PLAYING *playing)
{
	IT_ENVELOPE *envelope = &playing->env_instrument->volume_envelope;
	IT_PLAYING_ENVELOPE *pe = &playing->volume_envelope;

	if (update_it_envelope(playing, envelope, pe, IT_ENV_VOLUME)) {
		playing->flags |= IT_PLAYING_FADING;
		if (pe->value == 0)
			playing->flags |= IT_PLAYING_DEAD;
	}

	update_it_envelope(playing, &playing->env_instrument->pan_envelope, &playing->pan_envelope, IT_ENV_PANNING);
	update_it_envelope(playing, &playing->env_instrument->pitch_envelope, &playing->pitch_envelope, IT_ENV_PITCH);
}